

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::EnumValueDescriptorProto::~EnumValueDescriptorProto
          (EnumValueDescriptorProto *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__EnumValueDescriptorProto_00406ca8;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

EnumValueDescriptorProto::~EnumValueDescriptorProto() = default;